

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::ConstraintsBiLoad_C
          (ChLinkMateGeneric *this,double factor,double recovery_clamp,bool do_clamp)

{
  ChLinkMask *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  ChConstraintTwoBodies *pCVar7;
  ChConstraintTwoBodies *pCVar8;
  Scalar *pSVar9;
  int i;
  int iVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar16 [64];
  ulong local_48;
  undefined1 auVar13 [16];
  
  auVar16._8_56_ = in_register_00001248;
  auVar16._0_8_ = recovery_clamp;
  iVar5 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    this_00 = &this->mask;
    iVar10 = 0;
    iVar5 = 0;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar16._0_16_,auVar11);
    for (; iVar5 < (this->mask).nconstr; iVar5 = iVar5 + 1) {
      pCVar7 = ChLinkMask::Constr_N(this_00,iVar5);
      if ((pCVar7->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pCVar7 = ChLinkMask::Constr_N(this_00,iVar5);
        if (do_clamp) {
          iVar6 = (*(pCVar7->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[3])
                            (pCVar7);
          pCVar7 = ChLinkMask::Constr_N(this_00,iVar5);
          pCVar8 = ChLinkMask::Constr_N(this_00,iVar5);
          dVar1 = (pCVar8->super_ChConstraintTwo).super_ChConstraint.b_i;
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)&this->C,
                              (long)iVar10);
          local_48 = auVar11._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_48;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = factor * *pSVar9;
          auVar4 = vmaxsd_avx(auVar13,auVar2);
          dVar12 = auVar4._0_8_;
          if ((char)iVar6 == '\0') {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = recovery_clamp;
            auVar4 = vminsd_avx(auVar4,auVar3);
            dVar12 = auVar4._0_8_;
          }
          dVar12 = dVar12 + dVar1;
        }
        else {
          pCVar8 = ChLinkMask::Constr_N(this_00,iVar5);
          dVar12 = (pCVar8->super_ChConstraintTwo).super_ChConstraint.b_i;
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)&this->C,
                              (long)iVar10);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = factor;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = dVar12;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *pSVar9;
          auVar4 = vfmadd231sd_fma(auVar15,auVar14,auVar4);
          dVar12 = auVar4._0_8_;
        }
        iVar10 = iVar10 + 1;
        (pCVar7->super_ChConstraintTwo).super_ChConstraint.b_i = dVar12;
      }
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!this->IsActive())
        return;

    //***TEST***
    /*
        GetLog()<< "cload: " ;
        if (this->c_x) GetLog()<< " x";
        if (this->c_y) GetLog()<< " y";
        if (this->c_z) GetLog()<< " z";
        if (this->c_rx) GetLog()<< " Rx";
        if (this->c_ry) GetLog()<< " Ry";
        if (this->c_rz) GetLog()<< " Rz";
        GetLog()<< *this->C << "\n";
    */
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            if (do_clamp) {
                if (mask.Constr_N(i).IsUnilateral())
                    mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() +
                                              ChMax(factor * C(cnt), -recovery_clamp));
                else
                    mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() +
                                              ChMin(ChMax(factor * C(cnt), -recovery_clamp), recovery_clamp));
            } else
                mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() + factor * C(cnt));

            cnt++;
        }
    }
}